

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Glucose::Clause::Clause<Glucose::Clause>(Clause *this,Clause *ps,int _extra_size,bool learnt)

{
  uint uVar1;
  int iVar2;
  byte in_CL;
  uint in_EDX;
  Clause *in_RSI;
  ulong *in_RDI;
  int i;
  Lit in_stack_ffffffffffffffe0;
  int iVar3;
  int i_00;
  
  *in_RDI = *in_RDI & 0xfffffffffffffffc;
  *in_RDI = *in_RDI & 0xfffffffffffffffb | (ulong)(in_CL & 1) << 2;
  *in_RDI = *in_RDI & 0xffffffffffffffcf | ((ulong)in_EDX & 3) << 4;
  *in_RDI = *in_RDI & 0xffffffffffffff7f;
  uVar1 = size(in_RSI);
  *in_RDI = *in_RDI & 0xffffffff | (ulong)uVar1 << 0x20;
  *in_RDI = *in_RDI & 0xffffffff800007ff;
  *in_RDI = *in_RDI & 0xfffffffffffffff7 | 8;
  *in_RDI = *in_RDI & 0xfffffffffffffcff;
  *in_RDI = *in_RDI & 0xfffffffffffffbff;
  *in_RDI = *in_RDI & 0xffffffffffffffbf;
  iVar3 = 0;
  while (i_00 = iVar3, iVar2 = size(in_RSI), iVar3 < iVar2) {
    in_stack_ffffffffffffffe0 = operator[](in_RSI,i_00);
    *(int *)((long)in_RDI + (long)i_00 * 4 + 0xc) = in_stack_ffffffffffffffe0.x;
    iVar3 = i_00 + 1;
  }
  if ((*in_RDI >> 4 & 3) != 0) {
    if ((*in_RDI >> 2 & 1) == 0) {
      calcAbstraction((Clause *)CONCAT44(i_00,in_stack_ffffffffffffffe0.x));
    }
    else {
      *(undefined4 *)((long)in_RDI + (*in_RDI >> 0x20) * 4 + 0xc) = 0;
    }
    if (((uint)(*in_RDI >> 4) & 3) != 1 && (*in_RDI >> 4 & 3) != 0) {
      *(undefined4 *)((long)in_RDI + (ulong)((int)(*in_RDI >> 0x20) + 1) * 4 + 0xc) = 0;
    }
  }
  return;
}

Assistant:

Clause(const V& ps, int _extra_size, bool learnt) {
	assert(_extra_size < (1<<2));
        header.mark      = 0;
        header.learnt    = learnt;
        header.extra_size = _extra_size;
            header.reloced   = 0;
        header.size      = ps.size();
	header.lbd = 0;
	header.canbedel = 1;
	header.exported = 0; 
	header.oneWatched = 0;
	header.seen = 0;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
	
        if (header.extra_size > 0){
	  if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction();
	  if (header.extra_size > 1) {
	      data[header.size+1].abs = 0; // learntFrom
	  }	      
	}
    }